

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O3

bool __thiscall
chrono::collision::ChCollisionModelBullet::AddCopyOfAnotherModel
          (ChCollisionModelBullet *this,ChCollisionModel *other)

{
  cbtCollisionObject *pcVar1;
  float in_XMM0_Da;
  float fVar2;
  double dVar3;
  
  (*other->_vptr_ChCollisionModel[0x23])(other);
  dVar3 = (double)in_XMM0_Da;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x22])(dVar3,this);
  fVar2 = SUB84(dVar3,0);
  (*other->_vptr_ChCollisionModel[0x25])(other);
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x24])((double)fVar2,this);
  std::
  vector<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
  ::clear(&(this->super_ChCollisionModel).m_shapes);
  ChCollisionModel::CopyShapes(&this->super_ChCollisionModel,other);
  pcVar1 = (this->bt_collision_object)._M_t.
           super___uniq_ptr_impl<cbtCollisionObject,_std::default_delete<cbtCollisionObject>_>._M_t.
           super__Tuple_impl<0UL,_cbtCollisionObject_*,_std::default_delete<cbtCollisionObject>_>.
           super__Head_base<0UL,_cbtCollisionObject_*,_false>._M_head_impl;
  (*pcVar1->_vptr_cbtCollisionObject[2])(pcVar1,other[1]._vptr_ChCollisionModel[0x19]);
  (this->bt_compound_shape).super___shared_ptr<cbtCompoundShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = *(element_type **)&other[1].model_envelope;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->bt_compound_shape).
              super___shared_ptr<cbtCompoundShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&other[1].mcontactable);
  return true;
}

Assistant:

bool ChCollisionModelBullet::AddCopyOfAnotherModel(ChCollisionModel* other) {
    SetSafeMargin(other->GetSafeMargin());
    SetEnvelope(other->GetEnvelope());

    m_shapes.clear();
    CopyShapes(other);

    auto other_bt = static_cast<ChCollisionModelBullet*>(other);
    bt_collision_object->setCollisionShape(other_bt->GetBulletModel()->getCollisionShape());
    bt_compound_shape = other_bt->bt_compound_shape;

    return true;
}